

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall
cmCTestRunTest::ForkProcess
          (cmCTestRunTest *this,double testTimeOut,bool explicitTimeout,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *environment)

{
  cmCTest *this_00;
  bool bVar1;
  cmProcess *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  double dVar5;
  undefined1 local_1f8 [8];
  SaveRestoreEnvironment sre;
  ostringstream local_1b8 [8];
  ostringstream cmCTestLog_msg;
  double local_40;
  double timeout;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *environment_local;
  bool explicitTimeout_local;
  double testTimeOut_local;
  cmCTestRunTest *this_local;
  
  pcVar2 = (cmProcess *)operator_new(0xc0);
  cmProcess::cmProcess(pcVar2);
  this->TestProcess = pcVar2;
  cmProcess::SetId(this->TestProcess,this->Index);
  pcVar2 = this->TestProcess;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmProcess::SetWorkingDirectory(pcVar2,pcVar3);
  pcVar2 = this->TestProcess;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmProcess::SetCommand(pcVar2,pcVar3);
  cmProcess::SetCommandArguments(this->TestProcess,&this->Arguments);
  local_40 = cmCTest::GetRemainingTimeAllowed(this->CTest);
  local_40 = local_40 - 120.0;
  dVar5 = cmCTest::GetTimeOut(this->CTest);
  if (0.0 < dVar5) {
    dVar5 = cmCTest::GetTimeOut(this->CTest);
    if (dVar5 < local_40) {
      local_40 = cmCTest::GetTimeOut(this->CTest);
    }
  }
  if (0.0 < testTimeOut) {
    dVar5 = cmCTest::GetRemainingTimeAllowed(this->CTest);
    if (testTimeOut < dVar5) {
      local_40 = testTimeOut;
    }
  }
  if (local_40 <= 0.0) {
    local_40 = 1.0;
  }
  if (((testTimeOut == 0.0) && (!NAN(testTimeOut))) && (explicitTimeout)) {
    local_40 = 0.0;
  }
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar4 = (ostream *)std::ostream::operator<<(local_1b8,this->Index);
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::operator<<(poVar4,"Test timeout computed to be: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_40);
  std::operator<<(poVar4,"\n");
  this_00 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmCTestGenericHandler::GetQuiet(&this->TestHandler->super_cmCTestGenericHandler);
  cmCTest::Log(this_00,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2d0,pcVar3,bVar1);
  std::__cxx11::string::~string
            ((string *)
             &sre.Env.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  cmProcess::SetTimeout(this->TestProcess,local_40);
  cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment((SaveRestoreEnvironment *)local_1f8)
  ;
  if (environment !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(environment);
    if (!bVar1) {
      cmSystemTools::AppendEnv(environment);
    }
  }
  bVar1 = cmProcess::StartProcess(this->TestProcess);
  cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment
            ((SaveRestoreEnvironment *)local_1f8);
  return bVar1;
}

Assistant:

bool cmCTestRunTest::ForkProcess(double testTimeOut, bool explicitTimeout,
                     std::vector<std::string>* environment)
{
  this->TestProcess = new cmProcess;
  this->TestProcess->SetId(this->Index);
  this->TestProcess->SetWorkingDirectory(
        this->TestProperties->Directory.c_str());
  this->TestProcess->SetCommand(this->ActualCommand.c_str());
  this->TestProcess->SetCommandArguments(this->Arguments);

  // determine how much time we have
  double timeout = this->CTest->GetRemainingTimeAllowed() - 120;
  if (this->CTest->GetTimeOut() > 0 && this->CTest->GetTimeOut() < timeout)
    {
    timeout = this->CTest->GetTimeOut();
    }
  if (testTimeOut > 0
      && testTimeOut < this->CTest->GetRemainingTimeAllowed())
    {
    timeout = testTimeOut;
    }
  // always have at least 1 second if we got to here
  if (timeout <= 0)
    {
    timeout = 1;
    }
  // handle timeout explicitly set to 0
  if (testTimeOut == 0 && explicitTimeout)
    {
    timeout = 0;
    }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index << ": "
    << "Test timeout computed to be: " << timeout << "\n",
    this->TestHandler->GetQuiet());

  this->TestProcess->SetTimeout(timeout);

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmSystemTools::SaveRestoreEnvironment sre;
#endif

  if (environment && !environment->empty())
    {
    cmSystemTools::AppendEnv(*environment);
    }

  return this->TestProcess->StartProcess();
}